

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_states.cpp
# Opt level: O0

void ParseFunctionParameters
               (FScanner *sc,PClassActor *cls,TArray<FxExpression_*,_FxExpression_*> *out_params,
               PFunction *afd,FString *statestring,FStateDefinitions *statedef)

{
  TArray<FxExpression_*,_FxExpression_*> *cls_00;
  PClassActor *pPVar1;
  int iVar2;
  Variant *pVVar3;
  uint *puVar4;
  PType **ppPVar5;
  size_t sVar6;
  FxConstant *pFVar7;
  char *pcVar8;
  bool bVar9;
  FScriptPosition local_a0;
  undefined1 local_89;
  FScriptPosition local_88 [2];
  int local_64;
  FxConstant *pFStack_60;
  int v;
  FxExpression *x;
  uint local_50;
  uint uStack_4c;
  bool zeroparm;
  int pnum;
  int numparams;
  TArray<unsigned_int,_unsigned_int> *paramflags;
  TArray<PType_*,_PType_*> *params;
  FStateDefinitions *statedef_local;
  FString *statestring_local;
  PFunction *afd_local;
  TArray<FxExpression_*,_FxExpression_*> *out_params_local;
  PClassActor *cls_local;
  FScanner *sc_local;
  
  params = (TArray<PType_*,_PType_*> *)statedef;
  statedef_local = (FStateDefinitions *)statestring;
  statestring_local = (FString *)afd;
  afd_local = (PFunction *)out_params;
  out_params_local = (TArray<FxExpression_*,_FxExpression_*> *)cls;
  cls_local = (PClassActor *)sc;
  pVVar3 = TArray<PFunction::Variant,_PFunction::Variant>::operator[](&afd->Variants,0);
  paramflags = (TArray<unsigned_int,_unsigned_int> *)&pVVar3->Implementation->Proto->ArgumentTypes;
  pVVar3 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                     ((TArray<PFunction::Variant,_PFunction::Variant> *)(statestring_local + 5),0);
  _pnum = &pVVar3->ArgFlags;
  uStack_4c = TArray<PType_*,_PType_*>::Size((TArray<PType_*,_PType_*> *)paramflags);
  bVar9 = ((ulong)statestring_local[7].Chars & 2) != 0;
  if (bVar9) {
    uStack_4c = uStack_4c - 1;
  }
  local_50 = (uint)bVar9;
  if (((ulong)statestring_local[7].Chars & 4) != 0) {
    uStack_4c = uStack_4c - 2;
    local_50 = local_50 + 2;
  }
  if (-1 < (int)uStack_4c) {
    x._7_1_ = uStack_4c == 0;
    if (((int)uStack_4c < 1) ||
       (puVar4 = TArray<unsigned_int,_unsigned_int>::operator[](_pnum,(long)(int)local_50),
       (*puVar4 & 1) != 0)) {
      bVar9 = FScanner::CheckString((FScanner *)cls_local,"(");
      if (!bVar9) {
        return;
      }
    }
    else {
      FScanner::MustGetStringName((FScanner *)cls_local,"(");
    }
    do {
      do {
        if ((int)uStack_4c < 1) {
          if ((x._7_1_ & 1) == 0) {
            FScanner::MustGetStringName((FScanner *)cls_local,")");
          }
          else {
            bVar9 = FScanner::CheckString((FScanner *)cls_local,")");
            pPVar1 = cls_local;
            if (!bVar9) {
              pcVar8 = FName::GetChars((FName *)((long)&statestring_local[4].Chars + 4));
              FScanner::ScriptError
                        ((FScanner *)pPVar1,"You cannot pass parameters to \'%s\'\n",pcVar8);
            }
          }
          return;
        }
        if (((params == (TArray<PType_*,_PType_*> *)0x0) ||
            (ppPVar5 = TArray<PType_*,_PType_*>::operator[]
                                 ((TArray<PType_*,_PType_*> *)paramflags,(long)(int)local_50),
            *ppPVar5 != (PType *)TypeState)) ||
           (bVar9 = FScanner::CheckNumber((FScanner *)cls_local), !bVar9)) {
          pPVar1 = cls_local;
          cls_00 = out_params_local;
          ppPVar5 = TArray<PType_*,_PType_*>::operator[]
                              ((TArray<PType_*,_PType_*> *)paramflags,(long)(int)local_50);
          pFStack_60 = (FxConstant *)
                       ParseParameter((FScanner *)pPVar1,(PClassActor *)cls_00,*ppPVar5,false);
        }
        else {
          if ((0 < *(int *)&(cls_local->super_PClass).super_PStruct.super_PNamedType.
                            super_PCompoundType.super_PType.super_DObject.ObjNext) &&
             (sVar6 = FString::Len(statestring), 1 < sVar6)) {
            FScanner::ScriptError
                      ((FScanner *)cls_local,
                       "You cannot use state jumps commands with a jump offset on multistate definitions\n"
                      );
          }
          local_64 = *(int *)&(cls_local->super_PClass).super_PStruct.super_PNamedType.
                              super_PCompoundType.super_PType.super_DObject.ObjNext;
          if (local_64 < 0) {
            FScanner::ScriptError((FScanner *)cls_local,"Negative jump offsets are not allowed");
          }
          if (local_64 < 1) {
            pFVar7 = (FxConstant *)operator_new(0x48);
            FScriptPosition::FScriptPosition(&local_a0,(FScanner *)cls_local);
            FxConstant::FxConstant(pFVar7,(FState *)0x0,&local_a0);
            pFStack_60 = pFVar7;
            FScriptPosition::~FScriptPosition(&local_a0);
          }
          else {
            pFVar7 = (FxConstant *)operator_new(0x38);
            local_89 = 1;
            iVar2 = FStateDefinitions::GetStateCount((FStateDefinitions *)params);
            iVar2 = iVar2 + local_64;
            FScriptPosition::FScriptPosition(local_88,(FScanner *)cls_local);
            FxStateByIndex::FxStateByIndex((FxStateByIndex *)pFVar7,iVar2,local_88);
            local_89 = 0;
            pFStack_60 = pFVar7;
            FScriptPosition::~FScriptPosition(local_88);
          }
        }
        TArray<FxExpression_*,_FxExpression_*>::Push
                  ((TArray<FxExpression_*,_FxExpression_*> *)afd_local,
                   (FxExpression **)&stack0xffffffffffffffa0);
        local_50 = local_50 + 1;
        uStack_4c = uStack_4c - 1;
      } while ((int)uStack_4c < 1);
      ppPVar5 = TArray<PType_*,_PType_*>::operator[]
                          ((TArray<PType_*,_PType_*> *)paramflags,(long)(int)local_50);
      if (*ppPVar5 == (PType *)0x0) {
        bVar9 = FScanner::CheckString((FScanner *)cls_local,")");
        if (bVar9) {
          return;
        }
        local_50 = local_50 - 1;
        uStack_4c = uStack_4c + 1;
      }
      else {
        puVar4 = TArray<unsigned_int,_unsigned_int>::operator[](_pnum,(long)(int)local_50);
        if (((*puVar4 & 1) != 0) &&
           (bVar9 = FScanner::CheckString((FScanner *)cls_local,")"), bVar9)) {
          return;
        }
      }
      FScanner::MustGetStringName((FScanner *)cls_local,",");
    } while( true );
  }
  __assert_fail("numparams >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_states.cpp"
                ,0x272,
                "void ParseFunctionParameters(FScanner &, PClassActor *, TArray<FxExpression *> &, PFunction *, FString, FStateDefinitions *)"
               );
}

Assistant:

void ParseFunctionParameters(FScanner &sc, PClassActor *cls, TArray<FxExpression *> &out_params,
	PFunction *afd, FString statestring, FStateDefinitions *statedef)
{
	const TArray<PType *> &params = afd->Variants[0].Implementation->Proto->ArgumentTypes;
	const TArray<DWORD> &paramflags = afd->Variants[0].ArgFlags;
	int numparams = (int)params.Size();
	int pnum = 0;
	bool zeroparm;

	if (afd->Flags & VARF_Method)
	{
		numparams--;
		pnum++;
	}
	if (afd->Flags & VARF_Action)
	{
		numparams -= 2;
		pnum += 2;
	}
	assert(numparams >= 0);
	zeroparm = numparams == 0;
	if (numparams > 0 && !(paramflags[pnum] & VARF_Optional))
	{
		sc.MustGetStringName("(");
	}
	else
	{
		if (!sc.CheckString("(")) 
		{
			return;
		}
	}
	while (numparams > 0)
	{
		FxExpression *x;
		if (statedef != NULL && params[pnum] == TypeState && sc.CheckNumber())
		{
			// Special case: State label as an offset
			if (sc.Number > 0 && statestring.Len() > 1)
			{
				sc.ScriptError("You cannot use state jumps commands with a jump offset on multistate definitions\n");
			}

			int v = sc.Number;
			if (v < 0)
			{
				sc.ScriptError("Negative jump offsets are not allowed");
			}

			if (v > 0)
			{
				x = new FxStateByIndex(statedef->GetStateCount() + v, sc);
			}
			else
			{
				x = new FxConstant((FState*)NULL, sc);
			}
		}
		else
		{
			// Use the generic parameter parser for everything else
			x = ParseParameter(sc, cls, params[pnum], false);
		}
		out_params.Push(x);
		pnum++;
		numparams--;
		if (numparams > 0)
		{
			if (params[pnum] == NULL)
			{ // varargs function
				if (sc.CheckString(")"))
				{
					return;
				}
				pnum--;
				numparams++;
			}
			else if ((paramflags[pnum] & VARF_Optional) && sc.CheckString(")"))
			{
				return;
			}
			sc.MustGetStringName (",");
		}
	}
	if (zeroparm)
	{
		if (!sc.CheckString(")"))
		{
			sc.ScriptError("You cannot pass parameters to '%s'\n", afd->SymbolName.GetChars());
		}
	}
	else
	{
		sc.MustGetStringName(")");
	}
}